

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

QString * findInPath(QString *fileName)

{
  bool bVar1;
  ulong uVar2;
  QStringBuilder<const_QString_&,_char16_t> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char16_t> QVar3;
  QString *path_1;
  QStringList *__range1;
  QFileInfo fileInfo;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList paths;
  QLatin1Char separator;
  QString path;
  undefined8 in_stack_fffffffffffffea8;
  SplitBehaviorFlags flags;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *this;
  QStringBuilder<const_QString_&,_char16_t> *a;
  undefined1 local_e8 [24];
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *local_d0;
  QString *local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  char local_ab;
  ushort local_aa;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  QLatin1Char local_89;
  char local_88 [24];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  QString *local_58;
  char16_t local_50;
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  flags = (SplitBehaviorFlags)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  a = in_RDI;
  qgetenv(local_88);
  QString::fromLocal8Bit<void>((QByteArray *)in_RDI);
  QByteArray::~QByteArray((QByteArray *)0x128436);
  local_89.ch = -0x56;
  QLatin1Char::QLatin1Char(&local_89,':');
  local_a8 = 0xaaaaaaaaaaaaaaaa;
  local_a0 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_ab = local_89.ch;
  QChar::QChar<QLatin1Char,_true>((QChar *)in_RDI,(QLatin1Char)(char)((ulong)a >> 0x38));
  QFlags<Qt::SplitBehaviorFlags>::QFlags((QFlags<Qt::SplitBehaviorFlags> *)in_RDI,flags);
  QString::split((QChar)(char16_t)&local_a8,(QFlags *)&local_70,(uint)local_aa);
  local_b8.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_b8 = QList<QString>::begin((QList<QString> *)in_RDI);
  local_c0.i = (QString *)0xaaaaaaaaaaaaaaaa;
  local_c0 = QList<QString>::end((QList<QString> *)in_RDI);
  while( true ) {
    local_c8 = local_c0.i;
    bVar1 = QList<QString>::const_iterator::operator!=(&local_b8,local_c0);
    if (!bVar1) break;
    this = (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> *)
           0xaaaaaaaaaaaaaaaa;
    QList<QString>::const_iterator::operator*(&local_b8);
    local_d0 = this;
    QVar3 = operator+((QString *)a,(char16_t *)in_RDI);
    local_30 = QVar3.a;
    local_28 = QVar3.b;
    operator+(in_RDI,(QString *)this);
    QStringBuilder::operator_cast_to_QString(this);
    QFileInfo::QFileInfo((QFileInfo *)&local_d0,(QString *)local_e8);
    QString::~QString((QString *)0x128623);
    uVar2 = QFileInfo::exists();
    if ((((uVar2 & 1) == 0) || (uVar2 = QFileInfo::isFile(), (uVar2 & 1) == 0)) ||
       (uVar2 = QFileInfo::isExecutable(), (uVar2 & 1) == 0)) {
      bVar1 = false;
    }
    else {
      QVar3 = operator+((QString *)a,(char16_t *)in_RDI);
      local_58 = QVar3.a;
      local_50 = QVar3.b;
      operator+(in_RDI,(QString *)this);
      QStringBuilder::operator_cast_to_QString(this);
      bVar1 = true;
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_d0);
    if (bVar1) goto LAB_00128717;
    QList<QString>::const_iterator::operator++(&local_b8);
  }
  QString::QString((QString *)0x12870f);
LAB_00128717:
  QList<QString>::~QList((QList<QString> *)0x128724);
  QString::~QString((QString *)0x128731);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)a;
}

Assistant:

QString findInPath(const QString &fileName)
{
    const QString path = QString::fromLocal8Bit(qgetenv("PATH"));
#if defined(Q_OS_WIN32)
    QLatin1Char separator(';');
#else
    QLatin1Char separator(':');
#endif

    const QStringList paths = path.split(separator);
    for (const QString &path : paths) {
        QFileInfo fileInfo(path + u'/' + fileName);
        if (fileInfo.exists() && fileInfo.isFile() && fileInfo.isExecutable())
            return path + u'/' + fileName;
    }

    return QString();
}